

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O0

int TPJobInit(ThreadPoolJob *job,start_routine func,void *arg)

{
  void *arg_local;
  start_routine func_local;
  ThreadPoolJob *job_local;
  
  if ((job == (ThreadPoolJob *)0x0) || (func == (start_routine)0x0)) {
    job_local._4_4_ = 0x16;
  }
  else {
    job->func = func;
    job->arg = arg;
    job->priority = MED_PRIORITY;
    job->free_func = (free_routine)0x0;
    job_local._4_4_ = 0;
  }
  return job_local._4_4_;
}

Assistant:

int TPJobInit(ThreadPoolJob *job, start_routine func, void *arg)
{
	if (!job || !func)
		return EINVAL;
	job->func = func;
	job->arg = arg;
	job->priority = DEFAULT_PRIORITY;
	job->free_func = DEFAULT_FREE_ROUTINE;

	return 0;
}